

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

void __thiscall
SListBase<int,_Memory::ArenaAllocator,_RealCount>::RemoveHead
          (SListBase<int,_Memory::ArenaAllocator,_RealCount> *this,ArenaAllocator *allocator)

{
  SListNodeBase<Memory::ArenaAllocator> *this_00;
  Type_conflict pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type_conflict *ppSVar5;
  long *plVar6;
  long extraout_RDX;
  code *local_58;
  FreeFuncType freeFunc;
  NodeBase *node;
  ArenaAllocator *allocator_local;
  SListBase<int,_Memory::ArenaAllocator,_RealCount> *this_local;
  
  bVar3 = Empty(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x18b,"(!this->Empty())","!this->Empty()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppSVar5 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&this->super_SListNodeBase<Memory::ArenaAllocator>);
  this_00 = *ppSVar5;
  ppSVar5 = SListNodeBase<Memory::ArenaAllocator>::Next(this_00);
  pSVar1 = *ppSVar5;
  ppSVar5 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&this->super_SListNodeBase<Memory::ArenaAllocator>);
  *ppSVar5 = pSVar1;
  local_58 = (code *)Memory::TypeAllocatorFunc<Memory::ArenaAllocator,_int>::GetFreeFunc();
  plVar6 = (long *)((long)&(allocator->
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>)
                           .super_Allocator.outOfMemoryFunc + extraout_RDX);
  if (((ulong)local_58 & 1) != 0) {
    local_58 = *(code **)(local_58 + *plVar6 + -1);
  }
  (*local_58)(plVar6,this_00,0x10);
  RealCount::DecrementCount(&this->super_RealCount);
  return;
}

Assistant:

void RemoveHead(TAllocator * allocator)
    {
        Assert(!this->Empty());

        NodeBase * node = this->Next();
        this->Next() = node->Next();

        auto freeFunc = TypeAllocatorFunc<TAllocator, TData>::GetFreeFunc();
        AllocatorFree(allocator, freeFunc, (Node *) node, sizeof(Node));
        this->DecrementCount();
    }